

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O1

int32_t icu_63::SimpleTimeZone::compareToRule
                  (int8_t month,int8_t monthLen,int8_t prevMonthLen,int8_t dayOfMonth,
                  int8_t dayOfWeek,int32_t millis,int32_t millisDelta,EMode ruleMode,
                  int8_t ruleMonth,int8_t ruleDayOfWeek,int8_t ruleDay,int32_t ruleMillis)

{
  bool bVar1;
  uint uVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int8_t iVar7;
  int iVar8;
  int iVar9;
  
  iVar8 = millis + millisDelta;
  iVar4 = iVar8;
  if (86399999 < iVar8) {
    do {
      iVar4 = iVar8 + -86400000;
      cVar3 = dayOfMonth + '\x01';
      iVar6 = (int)((ulong)((long)dayOfWeek * -0x6db6db6d) >> 0x20) + (int)dayOfWeek;
      dayOfWeek = ((char)(iVar6 >> 2) - (char)(iVar6 >> 0x1f)) * -7 + dayOfWeek + 1;
      dayOfMonth = cVar3;
      if (monthLen < cVar3) {
        dayOfMonth = '\x01';
      }
      month = month + (monthLen < cVar3);
      bVar1 = 0xa4cb7ff < iVar8;
      iVar8 = iVar4;
    } while (bVar1);
  }
  iVar8 = iVar4;
  if (iVar4 < 0) {
    do {
      iVar4 = iVar8 + 86400000;
      cVar3 = dayOfMonth + -1;
      iVar6 = (int)((ulong)((long)(dayOfWeek + 5) * -0x6db6db6d) >> 0x20) + (int)dayOfWeek + 5;
      dayOfWeek = dayOfWeek + ((char)(iVar6 >> 2) - (char)(iVar6 >> 0x1f)) * -7 + 6;
      dayOfMonth = cVar3;
      if (cVar3 < '\x01') {
        dayOfMonth = prevMonthLen;
      }
      month = month - (cVar3 < '\x01');
      bVar1 = iVar8 < -86400000;
      iVar8 = iVar4;
    } while (bVar1);
  }
  if (month < ruleMonth) goto LAB_001eeed9;
  uVar2 = 1;
  if (ruleMonth < month) {
    return 1;
  }
  iVar7 = monthLen;
  if (ruleDay < monthLen) {
    iVar7 = ruleDay;
  }
  iVar8 = (int)dayOfMonth;
  switch(ruleMode) {
  case DOM_MODE:
    iVar6 = (int)iVar7;
    break;
  case DOW_IN_MONTH_MODE:
    if (iVar7 < '\x01') {
      iVar6 = ((int)dayOfWeek + (int)monthLen + 7) - (ruleDayOfWeek + iVar8);
      iVar9 = iVar6 / 7;
      iVar5 = iVar7 * 7 + (int)monthLen + 7;
      goto LAB_001ef082;
    }
    iVar9 = (int)~dayOfWeek + (int)ruleDayOfWeek + iVar8;
    iVar6 = (int)((ulong)((long)(iVar8 + (int)~dayOfWeek + (int)ruleDayOfWeek + 7) * -0x6db6db6d) >>
                 0x20) + iVar9 + 7;
    iVar6 = ((iVar6 >> 2) - (iVar6 >> 0x1f)) * -7 + iVar9 + iVar7 * 7 + 1;
    break;
  case DOW_GE_DOM_MODE:
    iVar5 = (int)iVar7;
    iVar6 = (int)ruleDayOfWeek - (dayOfWeek + iVar5);
    iVar9 = iVar6 + iVar8;
    iVar6 = (int)((ulong)((long)(iVar6 + iVar8 + 0x31) * -0x6db6db6d) >> 0x20) + iVar9 + 0x31;
    iVar6 = iVar9 + ((iVar6 >> 2) - (iVar6 >> 0x1f)) * -7 + 0x31;
    goto LAB_001ef085;
  case DOW_LE_DOM_MODE:
    iVar5 = (int)iVar7;
    iVar9 = ((iVar5 - ruleDayOfWeek) + (int)dayOfWeek) - iVar8;
    iVar6 = iVar9 + 0x31;
    iVar9 = iVar9 + (int)((ulong)((long)iVar6 * -0x6db6db6d) >> 0x20) + 0x31;
    iVar9 = (iVar9 >> 2) - (iVar9 >> 0x1f);
LAB_001ef082:
    iVar6 = iVar9 * 7 - iVar6;
LAB_001ef085:
    iVar6 = iVar6 + iVar5;
    break;
  default:
    iVar6 = 0;
  }
  if (iVar8 < iVar6) {
LAB_001eeed9:
    uVar2 = 0xffffffff;
  }
  else if ((iVar8 <= iVar6) && (uVar2 = 0xffffffff, ruleMillis <= iVar4)) {
    uVar2 = (uint)(ruleMillis < iVar4);
  }
  return uVar2;
}

Assistant:

int32_t 
SimpleTimeZone::compareToRule(int8_t month, int8_t monthLen, int8_t prevMonthLen,
                              int8_t dayOfMonth,
                              int8_t dayOfWeek, int32_t millis, int32_t millisDelta,
                              EMode ruleMode, int8_t ruleMonth, int8_t ruleDayOfWeek,
                              int8_t ruleDay, int32_t ruleMillis)
{
    // Make adjustments for startTimeMode and endTimeMode
    millis += millisDelta;
    while (millis >= U_MILLIS_PER_DAY) {
        millis -= U_MILLIS_PER_DAY;
        ++dayOfMonth;
        dayOfWeek = (int8_t)(1 + (dayOfWeek % 7)); // dayOfWeek is one-based
        if (dayOfMonth > monthLen) {
            dayOfMonth = 1;
            /* When incrementing the month, it is desirible to overflow
             * from DECEMBER to DECEMBER+1, since we use the result to
             * compare against a real month. Wraparound of the value
             * leads to bug 4173604. */
            ++month;
        }
    }
    while (millis < 0) {
        millis += U_MILLIS_PER_DAY;
        --dayOfMonth;
        dayOfWeek = (int8_t)(1 + ((dayOfWeek+5) % 7)); // dayOfWeek is one-based
        if (dayOfMonth < 1) {
            dayOfMonth = prevMonthLen;
            --month;
        }
    }

    // first compare months.  If they're different, we don't have to worry about days
    // and times
    if (month < ruleMonth) return -1;
    else if (month > ruleMonth) return 1;

    // calculate the actual day of month for the rule
    int32_t ruleDayOfMonth = 0;

    // Adjust the ruleDay to the monthLen, for non-leap year February 29 rule days.
    if (ruleDay > monthLen) {
        ruleDay = monthLen;
    }

    switch (ruleMode)
    {
    // if the mode is day-of-month, the day of month is given
    case DOM_MODE:
        ruleDayOfMonth = ruleDay;
        break;

    // if the mode is day-of-week-in-month, calculate the day-of-month from it
    case DOW_IN_MONTH_MODE:
        // In this case ruleDay is the day-of-week-in-month (this code is using
        // the dayOfWeek and dayOfMonth parameters to figure out the day-of-week
        // of the first day of the month, so it's trusting that they're really
        // consistent with each other)
        if (ruleDay > 0)
            ruleDayOfMonth = 1 + (ruleDay - 1) * 7 +
                (7 + ruleDayOfWeek - (dayOfWeek - dayOfMonth + 1)) % 7;
        
        // if ruleDay is negative (we assume it's not zero here), we have to do
        // the same calculation figuring backward from the last day of the month.
        else
        {
            // (again, this code is trusting that dayOfWeek and dayOfMonth are
            // consistent with each other here, since we're using them to figure
            // the day of week of the first of the month)
            ruleDayOfMonth = monthLen + (ruleDay + 1) * 7 -
                (7 + (dayOfWeek + monthLen - dayOfMonth) - ruleDayOfWeek) % 7;
        }
        break;

    case DOW_GE_DOM_MODE:
        ruleDayOfMonth = ruleDay +
            (49 + ruleDayOfWeek - ruleDay - dayOfWeek + dayOfMonth) % 7;
        break;

    case DOW_LE_DOM_MODE:
        ruleDayOfMonth = ruleDay -
            (49 - ruleDayOfWeek + ruleDay + dayOfWeek - dayOfMonth) % 7;
        // Note at this point ruleDayOfMonth may be <1, although it will
        // be >=1 for well-formed rules.
        break;
    }

    // now that we have a real day-in-month for the rule, we can compare days...
    if (dayOfMonth < ruleDayOfMonth) return -1;
    else if (dayOfMonth > ruleDayOfMonth) return 1;

    // ...and if they're equal, we compare times
    if (millis < ruleMillis) return -1;
    else if (millis > ruleMillis) return 1;
    else return 0;
}